

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpotController.cpp
# Opt level: O2

void anon_unknown.dwarf_4d3168::local_aggregate
               (char *query,Caliper *c,ChannelBody *chB,CaliperMetadataDB *db,Aggregator *output_agg
               )

{
  Aggregator agg;
  _Any_data local_228;
  code *local_218;
  code *pcStack_210;
  Preprocessor prp;
  RecordSelector filter;
  SnapshotProcessFn local_1e8;
  QuerySpec spec;
  
  parse_spec(&spec,query);
  cali::RecordSelector::RecordSelector(&filter,&spec);
  cali::Preprocessor::Preprocessor(&prp,&spec);
  cali::Aggregator::Aggregator(&agg,&spec);
  local_218 = (code *)0x0;
  pcStack_210 = (code *)0x0;
  local_228._M_unused._M_object = (void *)0x0;
  local_228._8_8_ = 0;
  local_228._M_unused._M_object = operator_new(0x20);
  *(CaliperMetadataDB **)local_228._M_unused._0_8_ = db;
  *(RecordSelector **)((long)local_228._M_unused._0_8_ + 8) = &filter;
  *(Preprocessor **)((long)local_228._M_unused._0_8_ + 0x10) = &prp;
  *(Aggregator **)((long)local_228._M_unused._0_8_ + 0x18) = &agg;
  pcStack_210 = std::
                _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/controllers/SpotController.cpp:59:9)>
                ::_M_invoke;
  local_218 = std::
              _Function_handler<void_(cali::CaliperMetadataAccessInterface_&,_const_std::vector<cali::Entry,_std::allocator<cali::Entry>_>_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Caliper/src/caliper/controllers/SpotController.cpp:59:9)>
              ::_M_manager;
  cali::Caliper::flush(c,chB,(SnapshotView)ZEXT816(0),(SnapshotFlushFn *)&local_228);
  std::_Function_base::~_Function_base((_Function_base *)&local_228);
  std::
  function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
  ::function<cali::Aggregator&,void>
            ((function<void(cali::CaliperMetadataAccessInterface&,std::vector<cali::Entry,std::allocator<cali::Entry>>const&)>
              *)&local_1e8,output_agg);
  cali::Aggregator::flush(&agg,&db->super_CaliperMetadataAccessInterface,&local_1e8);
  std::_Function_base::~_Function_base(&local_1e8.super__Function_base);
  cali::Aggregator::~Aggregator(&agg);
  cali::Preprocessor::~Preprocessor(&prp);
  cali::RecordSelector::~RecordSelector(&filter);
  cali::QuerySpec::~QuerySpec(&spec);
  return;
}

Assistant:

void local_aggregate(const char* query, Caliper& c, ChannelBody* chB, CaliperMetadataDB& db, Aggregator& output_agg)
{
    QuerySpec spec(parse_spec(query));

    RecordSelector filter(spec);
    Preprocessor   prp(spec);
    Aggregator     agg(spec);

    c.flush(
        chB,
        SnapshotView(),
        [&db, &filter, &prp, &agg](CaliperMetadataAccessInterface& in_db, const std::vector<Entry>& rec) {
            EntryList mrec = prp.process(db, db.merge_snapshot(in_db, rec));

            if (filter.pass(db, mrec))
                agg.add(db, mrec);
        }
    );

    // write intermediate results into output aggregator
    agg.flush(db, output_agg);
}